

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2e9d6::ReEscapeStrings::visit(ReEscapeStrings *this,LiteralString *lit)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  UString local_40;
  
  if (lit->tokenKind == RAW_DESUGARED) {
    iVar4 = 0;
    iVar3 = 0;
    for (lVar2 = 0; (lit->value)._M_string_length << 2 != lVar2; lVar2 = lVar2 + 4) {
      iVar1 = *(int *)((long)(lit->value)._M_dataplus._M_p + lVar2);
      iVar3 = iVar3 + (uint)(iVar1 == 0x27);
      iVar4 = iVar4 + (uint)(iVar1 == 0x22);
    }
    jsonnet::internal::jsonnet_string_escape(&local_40,&lit->value,iVar3 == 0 && iVar4 != 0);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    operator=(&lit->value,&local_40);
    std::__cxx11::u32string::~u32string((u32string *)&local_40);
    lit->tokenKind = (uint)(iVar3 != 0 || iVar4 == 0);
  }
  return;
}

Assistant:

void visit(LiteralString *lit)
    {
        if (lit->tokenKind != LiteralString::RAW_DESUGARED)
            return;

        // TODO: Share code with formatter.cpp EnforceStringStyle.
        unsigned num_single = 0, num_double = 0;
        for (char32_t c : lit->value) {
            if (c == '\'')
                num_single++;
            if (c == '"')
                num_double++;
        }
        bool use_single = (num_double > 0) && (num_single == 0);

        lit->value = jsonnet_string_escape(lit->value, use_single);
        lit->tokenKind = use_single ? LiteralString::SINGLE : LiteralString::DOUBLE;
    }